

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpwm.cc
# Opt level: O3

void __thiscall UnpackerTPWM::UnpackerTPWM(UnpackerTPWM *this,PBuffer *_buffer)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  ExceptionFreeserf *pEVar3;
  element_type *_size;
  bool bVar4;
  PBuffer id;
  string local_60;
  _func_int **local_40;
  element_type *local_38;
  
  _size = (_buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  this_00 = (_buffer->super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__Convertor_001571d0;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         _size;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00138534;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
    bVar4 = __libc_single_threaded != '\0';
    (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__Convertor_001571d0;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         _size;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    if (bVar4) goto LAB_00138528;
    LOCK();
    this_00->_M_use_count = this_00->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_00->_M_use_count = this_00->_M_use_count + 1;
    (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__Convertor_001571d0;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         _size;
    (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
LAB_00138528:
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  _size = (this->super_Convertor).buffer.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr;
LAB_00138534:
  (this->super_Convertor)._vptr_Convertor = (_func_int **)&PTR__Convertor_001577a0;
  if (_size->size < 8) {
    pEVar3 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Data is not TPWM archive","");
    ExceptionFreeserf::ExceptionFreeserf(pEVar3,&local_60);
    __cxa_throw(pEVar3,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
  }
  Buffer::pop((Buffer *)&stack0xffffffffffffffc0,(size_t)_size);
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,local_40[3],local_40[4] + (long)local_40[3]);
  iVar2 = std::__cxx11::string::compare((char *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (iVar2 == 0) {
    if (local_38 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
    }
    return;
  }
  pEVar3 = (ExceptionFreeserf *)__cxa_allocate_exception(0x28);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Data is not TPWM archive","")
  ;
  ExceptionFreeserf::ExceptionFreeserf(pEVar3,&local_60);
  __cxa_throw(pEVar3,&ExceptionFreeserf::typeinfo,ExceptionFreeserf::~ExceptionFreeserf);
}

Assistant:

UnpackerTPWM::UnpackerTPWM(PBuffer _buffer) : Convertor(_buffer) {
  if (buffer->get_size() < 8) {
    throw ExceptionFreeserf("Data is not TPWM archive");
  }

  PBuffer id = buffer->pop(4);
  if ((std::string)*id.get() != "TPWM") {
    throw ExceptionFreeserf("Data is not TPWM archive");
  }
}